

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall duckdb::Node::HasByte(Node *this,ART *art,uint8_t *byte)

{
  Node ptr;
  Node ptr_00;
  Node ptr_01;
  NType NVar1;
  BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8> *this_00;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *this_01;
  undefined8 uVar2;
  uint8_t *in_RDX;
  ART *in_RDI;
  NType type;
  undefined8 in_stack_ffffffffffffff50;
  NType type_00;
  allocator *paVar3;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined7 in_stack_ffffffffffffff78;
  NType in_stack_ffffffffffffff7f;
  Node256Leaf *in_stack_ffffffffffffff80;
  allocator local_61;
  string local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  InternalException *in_stack_ffffffffffffffc0;
  bool local_1;
  
  type_00 = (NType)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  NVar1 = GetType((Node *)0x18ce6b1);
  if (NVar1 == NODE_7_LEAF) {
    ptr.super_IndexPointer.data._6_1_ = 8;
    ptr.super_IndexPointer.data._0_6_ = in_stack_ffffffffffffff60;
    ptr.super_IndexPointer.data._7_1_ = in_stack_ffffffffffffff67;
    this_00 = &Ref<duckdb::Node7Leaf_const>(in_RDI,ptr,type_00)->
               super_BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8>;
    local_1 = BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::HasByte(this_00,in_RDX);
  }
  else if (NVar1 == NODE_15_LEAF) {
    ptr_00.super_IndexPointer.data._6_1_ = 9;
    ptr_00.super_IndexPointer.data._0_6_ = in_stack_ffffffffffffff60;
    ptr_00.super_IndexPointer.data._7_1_ = in_stack_ffffffffffffff67;
    this_01 = &Ref<duckdb::Node15Leaf_const>(in_RDI,ptr_00,type_00)->
               super_BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9>;
    local_1 = BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::HasByte(this_01,in_RDX);
  }
  else {
    if (NVar1 != NODE_256_LEAF) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar3 = &local_61;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"Invalid node type for GetNextByte: %s.",paVar3);
      EnumUtil::ToString<duckdb::NType>(in_stack_ffffffffffffff7f);
      InternalException::InternalException<std::__cxx11::string>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
    }
    ptr_01.super_IndexPointer.data._6_1_ = 10;
    ptr_01.super_IndexPointer.data._0_6_ = in_stack_ffffffffffffff60;
    ptr_01.super_IndexPointer.data._7_1_ = in_stack_ffffffffffffff67;
    Ref<duckdb::Node256Leaf>(in_RDI,ptr_01,type_00);
    local_1 = Node256Leaf::HasByte
                        (in_stack_ffffffffffffff80,
                         (uint8_t *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  }
  return local_1;
}

Assistant:

bool Node::HasByte(ART &art, uint8_t &byte) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::NODE_7_LEAF:
		return Ref<const Node7Leaf>(art, *this, NType::NODE_7_LEAF).HasByte(byte);
	case NType::NODE_15_LEAF:
		return Ref<const Node15Leaf>(art, *this, NType::NODE_15_LEAF).HasByte(byte);
	case NType::NODE_256_LEAF:
		return Ref<Node256Leaf>(art, *this, NType::NODE_256_LEAF).HasByte(byte);
	default:
		throw InternalException("Invalid node type for GetNextByte: %s.", EnumUtil::ToString(type));
	}
}